

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O3

void Gia_PolynBuildOne(Pln_Man_t *p,int iMono)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Hsh_VecMan_t *pHVar4;
  Gia_Man_t *pGVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  Vec_Int_t *pVVar11;
  ulong uVar12;
  Vec_Int_t *pVVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  
  pHVar4 = p->pHashM;
  pVVar13 = p->vCoefs;
  if (pVVar13->nSize != pHVar4->vMap->nSize) {
    __assert_fail("Vec_IntSize(p->vCoefs) == Hsh_VecSize(p->pHashM)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPolyn.c"
                  ,0x109,"void Gia_PolynBuildOne(Pln_Man_t *, int)");
  }
  if ((iMono < 0) || (pVVar13->nSize <= iMono)) goto LAB_006839a4;
  iVar2 = pHVar4->vMap->pArray[(uint)iMono];
  if (((long)iVar2 < 0) || (pHVar4->vData->nSize <= iVar2)) goto LAB_00683985;
  piVar1 = pHVar4->vData->pArray + iVar2;
  iVar2 = *piVar1;
  (pHVar4->vTemp).nCap = iVar2;
  (pHVar4->vTemp).nSize = iVar2;
  (pHVar4->vTemp).pArray = piVar1 + 2;
  if ((long)iVar2 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  iVar2 = piVar1[(long)iVar2 + 1];
  lVar15 = (long)iVar2;
  if ((lVar15 < 0) || (pGVar5 = p->pGia, pGVar5->nObjs <= iVar2)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar6 = pGVar5->pObjs;
  uVar3 = *(uint *)(pGVar6 + lVar15);
  if ((~uVar3 & 0x1fffffff) == 0 || (int)uVar3 < 0) {
    return;
  }
  if ((pGVar5->pMuxes != (uint *)0x0) && (pGVar5->pMuxes[lVar15] != 0)) {
    __assert_fail("!Gia_ObjIsMux(p->pGia, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPolyn.c"
                  ,0x10f,"void Gia_PolynBuildOne(Pln_Man_t *, int)");
  }
  if (pVVar13->nSize <= iMono) {
LAB_006839a4:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar3 = pVVar13->pArray[(uint)iMono];
  uVar12 = (ulong)uVar3;
  if (uVar12 == 0) {
    return;
  }
  pVVar13->pArray[(uint)iMono] = 0;
  p->nUsed = p->nUsed + -1;
  if (pGVar5->nObjs <= iVar2) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  pGVar6 = pGVar6 + lVar15;
  uVar10 = *(ulong *)pGVar6;
  uVar14 = 0;
  do {
    pVVar13 = p->vTempM[uVar14];
    pVVar13->nSize = 0;
    if ((pHVar4->vTemp).nSize < 1) {
LAB_00683966:
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
    }
    lVar15 = 0;
    do {
      Vec_IntPush(pVVar13,(pHVar4->vTemp).pArray[lVar15]);
      lVar15 = lVar15 + 1;
    } while (lVar15 < (pHVar4->vTemp).nSize);
    pVVar13 = p->vTempM[uVar14];
    if (pVVar13->nSize < 1) goto LAB_00683966;
    pVVar13->nSize = pVVar13->nSize + -1;
    if ((uVar14 & 1) != 0) {
      Vec_IntPushUniqueOrderCost(pVVar13,iVar2 - ((uint)uVar10 & 0x1fffffff),p->vOrder);
    }
    if (1 < uVar14) {
      Vec_IntPushUniqueOrderCost
                (p->vTempM[uVar14],iVar2 - ((uint)(uVar10 >> 0x20) & 0x1fffffff),p->vOrder);
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 4);
  if ((int)uVar3 < 0) goto LAB_006839a4;
  pHVar4 = p->pHashC;
  if (pHVar4->vMap->nSize <= (int)uVar3) goto LAB_006839a4;
  iVar2 = pHVar4->vMap->pArray[uVar12];
  if (((long)iVar2 < 0) || (pHVar4->vData->nSize <= iVar2)) goto LAB_00683985;
  piVar1 = pHVar4->vData->pArray + iVar2;
  iVar2 = *piVar1;
  (pHVar4->vTemp).nCap = iVar2;
  (pHVar4->vTemp).nSize = iVar2;
  (pHVar4->vTemp).pArray = piVar1 + 2;
  uVar10 = *(ulong *)pGVar6;
  uVar9 = (uint)uVar10;
  if (((~uVar9 & 0x1fffffff) == 0 || (int)uVar9 < 0) ||
     (((uint)(uVar10 >> 0x20) & 0x1fffffff) <= (uVar9 & 0x1fffffff))) {
    lVar15 = 0;
    bVar16 = true;
    do {
      bVar8 = bVar16;
      pVVar13 = p->vTempC[lVar15];
      pVVar13->nSize = 0;
      if (0 < (pHVar4->vTemp).nSize) {
        lVar15 = 0;
        do {
          iVar2 = (pHVar4->vTemp).pArray[lVar15];
          iVar7 = -iVar2;
          if (bVar8) {
            iVar7 = iVar2;
          }
          Vec_IntPush(pVVar13,iVar7);
          lVar15 = lVar15 + 1;
        } while (lVar15 < (pHVar4->vTemp).nSize);
      }
      lVar15 = 1;
      bVar16 = false;
    } while (bVar8);
    uVar10 = *(ulong *)pGVar6;
    bVar16 = (~(uint)uVar10 & 0x1fffffff) == 0;
  }
  else {
    bVar16 = false;
  }
  uVar9 = (uint)uVar10;
  if ((-1 < (int)uVar9 && !bVar16) && ((uVar9 & 0x1fffffff) < ((uint)(uVar10 >> 0x20) & 0x1fffffff))
     ) {
    pHVar4 = p->pHashC;
    if (pHVar4->vMap->nSize <= (int)uVar3) goto LAB_006839a4;
    iVar2 = pHVar4->vMap->pArray[uVar12];
    if (((long)iVar2 < 0) || (pHVar4->vData->nSize <= iVar2)) {
LAB_00683985:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    piVar1 = pHVar4->vData->pArray + iVar2;
    iVar2 = *piVar1;
    (pHVar4->vTemp).nCap = iVar2;
    (pHVar4->vTemp).nSize = iVar2;
    (pHVar4->vTemp).pArray = piVar1 + 2;
    pVVar13 = p->vTempC[0];
    pVVar13->nSize = 0;
    if (0 < (pHVar4->vTemp).nSize) {
      lVar15 = 0;
      do {
        Vec_IntPush(pVVar13,(pHVar4->vTemp).pArray[lVar15]);
        lVar15 = lVar15 + 1;
      } while (lVar15 < (pHVar4->vTemp).nSize);
      pVVar13 = p->vTempC[0];
    }
    Gia_PolynBuildAdd(p,pVVar13,p->vTempM[1]);
    pHVar4 = p->pHashC;
    if (pHVar4->vMap->nSize <= (int)uVar3) goto LAB_006839a4;
    iVar2 = pHVar4->vMap->pArray[uVar12];
    if (((long)iVar2 < 0) || (pHVar4->vData->nSize <= iVar2)) goto LAB_00683985;
    piVar1 = pHVar4->vData->pArray + iVar2;
    iVar2 = *piVar1;
    (pHVar4->vTemp).nCap = iVar2;
    (pHVar4->vTemp).nSize = iVar2;
    (pHVar4->vTemp).pArray = piVar1 + 2;
    pVVar13 = p->vTempC[0];
    pVVar13->nSize = 0;
    if (0 < (pHVar4->vTemp).nSize) {
      lVar15 = 0;
      do {
        Vec_IntPush(pVVar13,(pHVar4->vTemp).pArray[lVar15]);
        lVar15 = lVar15 + 1;
      } while (lVar15 < (pHVar4->vTemp).nSize);
      pVVar13 = p->vTempC[0];
    }
    Gia_PolynBuildAdd(p,pVVar13,p->vTempM[2]);
    pHVar4 = p->pHashC;
    if (pHVar4->vMap->nSize <= (int)uVar3) goto LAB_006839a4;
    iVar2 = pHVar4->vMap->pArray[uVar12];
    if (((long)iVar2 < 0) || (pHVar4->vData->nSize <= iVar2)) goto LAB_00683985;
    piVar1 = pHVar4->vData->pArray + iVar2;
    iVar2 = *piVar1;
    (pHVar4->vTemp).nCap = iVar2;
    (pHVar4->vTemp).nSize = iVar2;
    (pHVar4->vTemp).pArray = piVar1 + 2;
    pVVar13 = p->vTempC[0];
    pVVar13->nSize = 0;
    if (0 < (pHVar4->vTemp).nSize) {
      lVar15 = 0;
      do {
        uVar3 = (pHVar4->vTemp).pArray[lVar15];
        uVar9 = ~uVar3;
        if ((int)uVar3 < 1) {
          uVar9 = 1 - uVar3;
        }
        Vec_IntPush(pVVar13,uVar9);
        lVar15 = lVar15 + 1;
      } while (lVar15 < (pHVar4->vTemp).nSize);
      pVVar13 = p->vTempC[0];
    }
    pVVar11 = p->vTempM[3];
    goto LAB_00683953;
  }
  pVVar13 = p->vTempC[0];
  if ((uVar9 >> 0x1d & 1) == 0) {
    if ((uVar10 >> 0x3d & 1) != 0) {
      pVVar11 = p->vTempM[1];
LAB_0068386d:
      Gia_PolynBuildAdd(p,pVVar13,pVVar11);
      pVVar13 = p->vTempC[1];
    }
  }
  else {
    if ((uVar10 >> 0x3d & 1) == 0) {
      pVVar11 = p->vTempM[2];
      goto LAB_0068386d;
    }
    Gia_PolynBuildAdd(p,pVVar13,p->vTempM[0]);
    Gia_PolynBuildAdd(p,p->vTempC[1],p->vTempM[1]);
    pHVar4 = p->pHashC;
    if (pHVar4->vMap->nSize <= (int)uVar3) goto LAB_006839a4;
    iVar2 = pHVar4->vMap->pArray[uVar12];
    if (((long)iVar2 < 0) || (pHVar4->vData->nSize <= iVar2)) goto LAB_00683985;
    piVar1 = pHVar4->vData->pArray + iVar2;
    iVar2 = *piVar1;
    (pHVar4->vTemp).nCap = iVar2;
    (pHVar4->vTemp).nSize = iVar2;
    (pHVar4->vTemp).pArray = piVar1 + 2;
    lVar15 = 0;
    bVar16 = true;
    do {
      bVar8 = bVar16;
      pVVar13 = p->vTempC[lVar15];
      pVVar13->nSize = 0;
      if (0 < (pHVar4->vTemp).nSize) {
        lVar15 = 0;
        do {
          iVar2 = (pHVar4->vTemp).pArray[lVar15];
          iVar7 = -iVar2;
          if (bVar8) {
            iVar7 = iVar2;
          }
          Vec_IntPush(pVVar13,iVar7);
          lVar15 = lVar15 + 1;
        } while (lVar15 < (pHVar4->vTemp).nSize);
      }
      lVar15 = 1;
      bVar16 = false;
    } while (bVar8);
    Gia_PolynBuildAdd(p,p->vTempC[1],p->vTempM[2]);
    pVVar13 = p->vTempC[0];
  }
  pVVar11 = p->vTempM[3];
LAB_00683953:
  Gia_PolynBuildAdd(p,pVVar13,pVVar11);
  return;
}

Assistant:

void Gia_PolynBuildOne( Pln_Man_t * p, int iMono )
{
    Gia_Obj_t * pObj; 
    Vec_Int_t * vArray, * vConst;
    int iFan0, iFan1;
    int k, iConst, iDriver;

    assert( Vec_IntSize(p->vCoefs) == Hsh_VecSize(p->pHashM) );
    vArray  = Hsh_VecReadEntry( p->pHashM, iMono );
    iDriver = Vec_IntEntryLast( vArray );
    pObj    = Gia_ManObj( p->pGia, iDriver );
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    assert( !Gia_ObjIsMux(p->pGia, pObj) );

    iConst = Vec_IntEntry( p->vCoefs, iMono );
    if ( iConst == 0 )
        return;
    Vec_IntWriteEntry( p->vCoefs, iMono, 0 );
    p->nUsed--;

    iFan0 = Gia_ObjFaninId0p(p->pGia, pObj);
    iFan1 = Gia_ObjFaninId1p(p->pGia, pObj);
    for ( k = 0; k < 4; k++ )
    {
        Vec_IntClear( p->vTempM[k] );
        Vec_IntAppend( p->vTempM[k], vArray );
        Vec_IntPop( p->vTempM[k] );
        if ( k == 1 || k == 3 )
            Vec_IntPushUniqueOrderCost( p->vTempM[k], iFan0, p->vOrder );    // x
//            Vec_IntPushUniqueOrder( p->vTempM[k], iFan0 );    // x
        if ( k == 2 || k == 3 )
            Vec_IntPushUniqueOrderCost( p->vTempM[k], iFan1, p->vOrder );    // y
//            Vec_IntPushUniqueOrder( p->vTempM[k], iFan1 );    // y
    }

    vConst = Hsh_VecReadEntry( p->pHashC, iConst );

    if ( !Gia_ObjIsXor(pObj) )
        for ( k = 0; k < 2; k++ )
            Vec_IntAppendMinus( p->vTempC[k], vConst, k );

    if ( Gia_ObjIsXor(pObj) )
    {
        vConst = Hsh_VecReadEntry( p->pHashC, iConst );
        Vec_IntAppendMinus( p->vTempC[0], vConst, 0 );
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[1] );   //  C * x 

        vConst = Hsh_VecReadEntry( p->pHashC, iConst );
        Vec_IntAppendMinus( p->vTempC[0], vConst, 0 );
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[2] );   //  C * y 

        //if ( !p->pGia->vXors || Vec_IntFind(p->pGia->vXors, iDriver) == -1 || Vec_IntFind(p->pGia->vXors, iDriver) == 5 )
        { 
            vConst = Hsh_VecReadEntry( p->pHashC, iConst );
            Vec_IntAppendMinus2x( p->vTempC[0], vConst );
            Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[3] );   // -C * x * y 
        }
    }
    else if ( Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )  //  C * (1 - x) * (1 - y)
    {
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[0] );   //  C * 1
        Gia_PolynBuildAdd( p, p->vTempC[1], p->vTempM[1] );   // -C * x
        vConst = Hsh_VecReadEntry( p->pHashC, iConst );
        for ( k = 0; k < 2; k++ )
            Vec_IntAppendMinus( p->vTempC[k], vConst, k );
        Gia_PolynBuildAdd( p, p->vTempC[1], p->vTempM[2] );   // -C * y 
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[3] );   //  C * x * y
    }
    else if ( Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) ) //  C * (1 - x) * y
    {
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[2] );   //  C * y 
        Gia_PolynBuildAdd( p, p->vTempC[1], p->vTempM[3] );   // -C * x * y
    }
    else if ( !Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) ) //  C * x * (1 - y)
    {
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[1] );   //  C * x 
        Gia_PolynBuildAdd( p, p->vTempC[1], p->vTempM[3] );   // -C * x * y
    }
    else   
        Gia_PolynBuildAdd( p, p->vTempC[0], p->vTempM[3] );   //  C * x * y
}